

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis_weighted<double,unsigned_long,long_double>
                 (size_t col_num,size_t nrows,double *Xc,unsigned_long *Xc_ind,
                 unsigned_long *Xc_indptr,MissingAction missing_action,double *w)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  unsigned_long ix;
  ulong uVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble lVar12;
  longdouble lVar13;
  longdouble local_e4;
  long local_78;
  ushort uStack_70;
  long local_68;
  ushort uStack_60;
  
  uVar5 = Xc_indptr[col_num];
  uVar1 = Xc_indptr[col_num + 1];
  if (uVar5 != uVar1) {
    lVar3 = (nrows + uVar5) - uVar1;
    lVar6 = (longdouble)lVar3 + (longdouble)(float)(&DAT_0036e0d8)[lVar3 < 0];
    uVar4 = uVar5;
    if (uVar5 < uVar1) {
      do {
        lVar6 = lVar6 + (longdouble)w[Xc_ind[uVar4]];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    lVar9 = (longdouble)0;
    if (lVar9 < lVar6) {
      if (missing_action == Fail) {
        lVar7 = in_ST1;
        lVar11 = in_ST1;
        lVar12 = in_ST1;
        if (uVar1 <= uVar5) {
          return -INFINITY;
        }
        do {
          lVar10 = lVar12;
          lVar9 = lVar11;
          lVar8 = lVar7;
          local_e4 = in_ST0;
          lVar7 = in_ST1;
          lVar11 = in_ST1;
          lVar12 = in_ST1;
          fmal();
          fmal();
          lVar13 = lVar12;
          fmal();
          fmal();
          uVar5 = uVar5 + 1;
          in_ST0 = in_ST1;
          in_ST1 = lVar13;
        } while (uVar1 != uVar5);
      }
      else {
        lVar8 = lVar9;
        lVar10 = lVar9;
        local_e4 = lVar9;
        if (uVar5 < uVar1) {
          lVar9 = (longdouble)0;
          lVar8 = lVar9;
          lVar10 = lVar9;
          local_e4 = lVar9;
          do {
            lVar7 = (longdouble)Xc[uVar5];
            local_68 = SUB108(lVar7,0);
            uStack_60 = (ushort)((unkuint10)lVar7 >> 0x40);
            lVar7 = in_ST0;
            if ((NAN(Xc[uVar5])) || ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000))
            {
              lVar6 = lVar6 - (longdouble)w[Xc_ind[uVar5]];
            }
            else {
              lVar8 = in_ST0;
              lVar9 = in_ST0;
              lVar10 = in_ST0;
              fmal();
              fmal();
              fmal();
              fmal();
              local_e4 = in_ST0;
            }
            uVar5 = uVar5 + 1;
            in_ST0 = lVar7;
          } while (uVar1 != uVar5);
        }
        if (lVar6 <= (longdouble)0) {
          return -INFINITY;
        }
      }
      if ((longdouble)1 < lVar6) {
        if ((lVar8 != (longdouble)0) || (NAN(lVar8) || NAN((longdouble)0))) {
          if ((lVar8 != local_e4 * local_e4) || (NAN(lVar8) || NAN(local_e4 * local_e4))) {
            lVar7 = local_e4 / lVar6;
            lVar11 = lVar7 * lVar7;
            lVar12 = lVar8 / lVar6 - lVar11;
            if ((!NAN(lVar12)) &&
               (((longdouble)2.220446e-16 < lVar12 ||
                ((bVar2 = check_more_than_two_unique_values<double,unsigned_long>
                                    (nrows,col_num,Xc_indptr,Xc_ind,Xc,missing_action),
                 (longdouble)0 < lVar12 && (bVar2)))))) {
              lVar6 = (lVar7 * lVar11 * lVar7 * lVar6 +
                      local_e4 * (longdouble)-4.0 * lVar11 * lVar7 +
                      lVar8 * (longdouble)6.0 * lVar11 + lVar9 * (longdouble)-4.0 * lVar7 + lVar10)
                      / (lVar12 * lVar12 * lVar6);
              uStack_70 = (ushort)((unkuint10)lVar6 >> 0x40);
              local_78 = SUB108(lVar6,0);
              if (((unkuint10)lVar6 & 0x7fff) == 0 ||
                  (ushort)((uStack_70 & 0x7fff) - 1) < 0x7ffe && local_78 < 0) {
                if ((double)lVar6 <= 0.0) {
                  return 0.0;
                }
                return (double)lVar6;
              }
            }
          }
        }
      }
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t col_num, size_t nrows,
                              real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                              MissingAction missing_action, real_t *restrict w)
{
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
        return -HUGE_VAL;

    ldouble_safe s1 = 0;
    ldouble_safe s2 = 0;
    ldouble_safe s3 = 0;
    ldouble_safe s4 = 0;
    ldouble_safe x_sq;
    ldouble_safe w_this;
    ldouble_safe cnt = nrows - (Xc_indptr[col_num + 1] - Xc_indptr[col_num]);
    for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        cnt += w[Xc_ind[ix]];

    if (unlikely(cnt <= 0)) return -HUGE_VAL;
    
    ldouble_safe xval;

    if (missing_action != Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            if (unlikely(is_na_or_inf(xval)))
            {
                cnt -= w_this;
            }

            else
            {
                x_sq = xval * xval;
                s1 = std::fma(w_this, xval, s1);
                s2 = std::fma(w_this, x_sq, s2);
                s3 = std::fma(w_this, x_sq*xval, s3);
                s4 = std::fma(w_this, x_sq*x_sq, s4);
                // s1 += w_this * pw1(xval);
                // s2 += w_this * pw2(xval);
                // s3 += w_this * pw3(xval);
                // s4 += w_this * pw4(xval);
            }
        }

        if (cnt <= 0) return -HUGE_VAL;
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num + 1]; ix++)
        {
            w_this = w[Xc_ind[ix]];
            xval = Xc[ix];

            x_sq = xval * xval;
            s1 = std::fma(w_this, xval, s1);
            s2 = std::fma(w_this, x_sq, s2);
            s3 = std::fma(w_this, x_sq*xval, s3);
            s4 = std::fma(w_this, x_sq*x_sq, s4);
            // s1 += w_this * pw1(xval);
            // s2 += w_this * pw2(xval);
            // s3 += w_this * pw3(xval);
            // s4 += w_this * pw4(xval);
        }
    }

    if (unlikely(cnt <= 1 || s2 == 0 || s2 == pw2(s1))) return -HUGE_VAL;
    ldouble_safe sn = s1 / cnt;
    ldouble_safe v  = s2 / cnt - pw2(sn);
    if (unlikely(std::isnan(v))) return -HUGE_VAL;
    if (
        v <= std::numeric_limits<double>::epsilon() &&
        !check_more_than_two_unique_values(nrows, col_num,
                                           Xc_indptr, Xc_ind, Xc,
                                           missing_action)
    )
        return -HUGE_VAL;
    if (unlikely(v <= 0)) return -HUGE_VAL;
    ldouble_safe out =  (s4 - 4 * s3 * sn + 6 * s2 * pw2(sn) - 4 * s1 * pw3(sn) + cnt * pw4(sn)) / (cnt * pw2(v));
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}